

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

int __thiscall
RuntimeVariableSymbol::clone
          (RuntimeVariableSymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  RuntimeSymbol local_28;
  _Alloc_hider _Stack_20;
  
  local_28._vptr_RuntimeSymbol = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RuntimeVariableSymbol,std::allocator<RuntimeVariableSymbol>,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>const&,Context_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_20,
             (RuntimeVariableSymbol **)&local_28,(allocator<RuntimeVariableSymbol> *)&local_29,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 8),
             (TypeName *)(__fn + 0x28),(shared_ptr<ExpressionNode> *)(__fn + 0x30),
             (Context *)__child_stack);
  (this->name_)._M_dataplus._M_p = (pointer)0x0;
  (this->super_RuntimeSymbol)._vptr_RuntimeSymbol = local_28._vptr_RuntimeSymbol;
  (this->name_)._M_dataplus._M_p = _Stack_20._M_p;
  return (int)this;
}

Assistant:

std::shared_ptr<RuntimeSymbol> RuntimeVariableSymbol::clone(const Context& context) const
{
  return std::make_shared<RuntimeVariableSymbol>(name_, type_, value_, context);
}